

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tipc_listener.cpp
# Opt level: O2

int __thiscall
zmq::tipc_listener_t::accept(tipc_listener_t *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint __errnum;
  int iVar1;
  uint *puVar2;
  char *errmsg_;
  socklen_t ss_len;
  sockaddr_storage ss;
  socklen_t local_9c;
  sockaddr local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98.sa_family = 0;
  local_98.sa_data[0] = '\0';
  local_98.sa_data[1] = '\0';
  local_98.sa_data[2] = '\0';
  local_98.sa_data[3] = '\0';
  local_98.sa_data[4] = '\0';
  local_98.sa_data[5] = '\0';
  local_98.sa_data[6] = '\0';
  local_98.sa_data[7] = '\0';
  local_98.sa_data[8] = '\0';
  local_98.sa_data[9] = '\0';
  local_98.sa_data[10] = '\0';
  local_98.sa_data[0xb] = '\0';
  local_98.sa_data[0xc] = '\0';
  local_98.sa_data[0xd] = '\0';
  local_9c = 0x80;
  iVar1 = (this->super_stream_listener_base_t)._s;
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tipc_listener.cpp"
            ,0x9d);
    fflush(_stderr);
    zmq_abort("_s != retired_fd");
    iVar1 = (this->super_stream_listener_base_t)._s;
  }
  iVar1 = ::accept(iVar1,&local_98,&local_9c);
  if (iVar1 == -1) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    if (((0x18 < __errnum) || ((0x1800810U >> (__errnum & 0x1f) & 1) == 0)) &&
       ((0x22 < __errnum - 0x47 || ((0x500000001U >> ((ulong)(__errnum - 0x47) & 0x3f) & 1) == 0))))
    {
      errmsg_ = strerror(__errnum);
      fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tipc_listener.cpp"
              ,0xa8);
      fflush(_stderr);
      zmq_abort(errmsg_);
    }
  }
  return iVar1;
}

Assistant:

zmq::fd_t zmq::tipc_listener_t::accept ()
{
    //  Accept one connection and deal with different failure modes.
    //  The situation where connection cannot be accepted due to insufficient
    //  resources is considered valid and treated by ignoring the connection.
    struct sockaddr_storage ss = {};
    socklen_t ss_len = sizeof (ss);

    zmq_assert (_s != retired_fd);
#ifdef ZMQ_HAVE_VXWORKS
    fd_t sock = ::accept (_s, (struct sockaddr *) &ss, (int *) &ss_len);
#else
    fd_t sock =
      ::accept (_s, reinterpret_cast<struct sockaddr *> (&ss), &ss_len);
#endif
    if (sock == -1) {
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK
                      || errno == ENOBUFS || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == EMFILE || errno == ENFILE);
        return retired_fd;
    }
    /*FIXME Accept filters?*/
    return sock;
}